

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.h
# Opt level: O1

bool __thiscall CDBWrapper::Exists<unsigned_char>(CDBWrapper *this,uchar *key)

{
  bool bVar1;
  long in_FS_OFFSET;
  Span<const_std::byte> key_00;
  _Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> local_48;
  long lStack_30;
  uchar local_19;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lStack_30 = 0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::reserve
            ((vector<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_48,0x40);
  local_19 = *key;
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)&local_48,
             local_48._M_impl.super__Vector_impl_data._M_finish,&local_19);
  key_00.m_data = local_48._M_impl.super__Vector_impl_data._M_start + lStack_30;
  key_00.m_size = (long)local_48._M_impl.super__Vector_impl_data._M_finish - (long)key_00.m_data;
  bVar1 = ExistsImpl(this,key_00);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool Exists(const K& key) const
    {
        DataStream ssKey{};
        ssKey.reserve(DBWRAPPER_PREALLOC_KEY_SIZE);
        ssKey << key;
        return ExistsImpl(ssKey);
    }